

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoButton_Editor_Common
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  bool bVar1;
  CUI *this_00;
  void *pvVar2;
  void *in_RSI;
  CEditor *in_RDI;
  CUI *in_R8;
  uint in_R9D;
  char *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  UI(in_RDI);
  bVar1 = CUI::MouseInside((CUI *)in_RDI,
                           (CUIRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  if (bVar1) {
    if ((in_R9D & 1) != 0) {
      ms_pUiGotContext = in_RSI;
    }
    if (in_RDI->m_pTooltip != (char *)0x0) {
      in_RDI->m_pTooltip = in_stack_00000008;
    }
  }
  this_00 = UI(in_RDI);
  pvVar2 = CUI::HotItem(this_00);
  if ((pvVar2 == in_RSI) && (in_stack_00000008 != (char *)0x0)) {
    in_RDI->m_pTooltip = in_stack_00000008;
  }
  UI(in_RDI);
  bVar1 = CUI::DoButtonLogic(in_R8,(void *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                             (CUIRect *)in_RDI,in_stack_ffffffffffffffbc);
  if (bVar1) {
    local_4 = 1;
  }
  else {
    UI(in_RDI);
    bVar1 = CUI::DoButtonLogic(in_R8,(void *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                               (CUIRect *)in_RDI,in_stack_ffffffffffffffbc);
    if (bVar1) {
      local_4 = 2;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CEditor::DoButton_Editor_Common(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	if(UI()->MouseInside(pRect))
	{
		if(Flags&BUTTON_CONTEXT)
			ms_pUiGotContext = pID;
		if(m_pTooltip)
			m_pTooltip = pToolTip;
	}

	if(UI()->HotItem() == pID && pToolTip)
		m_pTooltip = (const char *)pToolTip;

	if(UI()->DoButtonLogic(pID, pRect, 0))
		return 1;
	if(UI()->DoButtonLogic(pID, pRect, 1))
		return 2;
	return 0;
}